

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O1

ChQuaternion<double> * __thiscall
chrono::ChFunctionRotation_SQUAD::Get_q
          (ChQuaternion<double> *__return_storage_ptr__,ChFunctionRotation_SQUAD *this,double s)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  pointer pCVar4;
  pointer pCVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  ChQuaternion<double> q2;
  ChQuaternion<double> q1;
  ChQuaternion<double> slerp1;
  ChQuaternion<double> slerp0;
  ChQuaternion<double> s1;
  ChQuaternion<double> s0;
  ChQuaternion<double> local_138;
  ChQuaternion<double> local_118;
  ChQuaternion<double> local_f0;
  ChQuaternion<double> local_d0;
  ChQuaternion<double> local_b0;
  ChQuaternion<double> local_90;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  if (this->closed == true) {
    s = fmod(s,1.0);
  }
  dVar12 = ComputeKnotUfromU(this,s);
  lVar2 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  lVar7 = 2;
  if (2 < lVar2) {
    lVar7 = lVar2;
  }
  lVar11 = 1;
  if (1 < lVar2) {
    lVar11 = lVar2;
  }
  uVar8 = 0xffffffffffffffff;
  do {
    uVar9 = lVar7 - 2;
    if ((2 - lVar7) + uVar8 == -1) break;
    if ((1 - lVar11) + uVar8 == -1) goto LAB_008c0eea;
    lVar6 = uVar8 + 2;
    uVar8 = uVar8 + 1;
    uVar9 = uVar8;
  } while ((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[lVar6] <= dVar12);
  if ((long)uVar9 < lVar2) {
    uVar8 = (ulong)((int)uVar9 + 1);
    if ((long)uVar8 < lVar2) {
      pdVar3 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      dVar1 = pdVar3[uVar9];
      pCVar4 = (this->rotations).
               super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d0.m_data[0] = pCVar4[uVar9].m_data[0];
      local_d0.m_data[1] = pCVar4[uVar9].m_data[1];
      local_d0.m_data[2] = pCVar4[uVar9].m_data[2];
      local_d0.m_data[3] = pCVar4[uVar9].m_data[3];
      local_f0.m_data[0] = pCVar4[uVar8].m_data[0];
      local_f0.m_data[1] = pCVar4[uVar8].m_data[1];
      local_f0.m_data[2] = pCVar4[uVar8].m_data[2];
      local_f0.m_data[3] = pCVar4[uVar8].m_data[3];
      if ((int)uVar9 == 0) {
        local_138.m_data[3] = local_d0.m_data[3];
        local_138.m_data[0] = local_d0.m_data[0];
        local_138.m_data[1] = local_d0.m_data[1];
        local_138.m_data[2] = local_d0.m_data[2];
        if (this->closed == true) {
          pCVar5 = (this->rotations).
                   super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_138.m_data[3] = pCVar5[-2].m_data[3];
          local_138.m_data[0] = pCVar5[-2].m_data[0];
          local_138.m_data[1] = pCVar5[-2].m_data[1];
          local_138.m_data[2] = pCVar5[-2].m_data[2];
        }
      }
      else {
        uVar10 = uVar9 & 0xffffffff;
        local_138.m_data[3] = pCVar4[uVar10 - 1].m_data[3];
        local_138.m_data[0] = pCVar4[uVar10 - 1].m_data[0];
        local_138.m_data[1] = pCVar4[uVar10 - 1].m_data[1];
        local_138.m_data[2] = pCVar4[uVar10 - 1].m_data[2];
      }
      if (uVar9 < ((long)(this->rotations).
                         super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 5) - 2U) {
        uVar9 = uVar9 & 0xffffffff;
        local_118.m_data[3] = pCVar4[uVar9 + 2].m_data[3];
        local_118.m_data[0] = pCVar4[uVar9 + 2].m_data[0];
        local_118.m_data[1] = pCVar4[uVar9 + 2].m_data[1];
        local_118.m_data[2] = pCVar4[uVar9 + 2].m_data[2];
      }
      else {
        local_118.m_data[3] = local_f0.m_data[3];
        local_118.m_data[0] = local_f0.m_data[0];
        local_118.m_data[1] = local_f0.m_data[1];
        local_118.m_data[2] = local_f0.m_data[2];
        if (this->closed == true) {
          local_118.m_data[3] = pCVar4[1].m_data[3];
          local_118.m_data[0] = pCVar4[1].m_data[0];
          local_118.m_data[1] = pCVar4[1].m_data[1];
          local_118.m_data[2] = pCVar4[1].m_data[2];
        }
      }
      dVar12 = (dVar12 - dVar1) / (pdVar3[uVar8] - dVar1);
      QUADRANGLE(&local_50,&local_138,&local_d0,&local_f0);
      QUADRANGLE(&local_70,&local_d0,&local_f0,&local_118);
      SLERP(&local_90,&local_d0,&local_f0,dVar12);
      SLERP(&local_b0,&local_50,&local_70,dVar12);
      SLERP(__return_storage_ptr__,&local_90,&local_b0,(dVar12 + dVar12) * (1.0 - dVar12));
      return __return_storage_ptr__;
    }
  }
LAB_008c0eea:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

ChQuaternion<> ChFunctionRotation_SQUAD::Get_q(double s) const {
	
	double fs = space_fx->Get_y(s);

	double mU;
	if (this->closed)
		mU = fmod(fs, 1.0);
	else
		mU = fs;

    double u = ComputeKnotUfromU(mU);

	// Linear search of span in knot vector. Bisection could be faster, but for small number of knots this is efficient anyway.
	int spanU = 0;
	for (; spanU < this->knots.size()-2; ++spanU)
		if (u < this->knots(spanU+1))
			break;
	
	double span_t = (u - this->knots(spanU)) / (this->knots(spanU + 1) - this->knots(spanU));

	ChQuaternion<> q1 = rotations[spanU];
	ChQuaternion<> q2 = rotations[spanU+1];
	
	ChQuaternion<> q0;
	ChQuaternion<> q3;
	
	if (spanU > 0) {
		q0 = rotations[spanU - 1];
	} 
	else {
		if (this->closed)
			q0 = rotations[rotations.size()-2];
		else
			q0 = q1;
	}

	if (spanU < rotations.size()-2) {
		q3 = rotations[spanU +2];
	} 
	else {
		if (this->closed)
			q3 = rotations[1];
		else
			q3 = q2;
	}

	// TEST: do a simple SLERP
	//return SLERP(q1, q2, span_t);

	ChQuaternion<> s0 = QUADRANGLE(q0, q1, q2);
	ChQuaternion<> s1 = QUADRANGLE(q1, q2, q3);
	
	ChQuaternion<> slerp0 = SLERP(q1, q2, span_t);
    ChQuaternion<> slerp1 = SLERP(s0, s1, span_t);
        
	return SLERP(slerp0, slerp1, 2.0 * span_t * (1.0 - span_t));

}